

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenutypes.cpp
# Opt level: O3

QDBusArgument * operator>>(QDBusArgument *arg,QDBusMenuLayoutItem *item)

{
  char cVar1;
  bool bVar2;
  QDBusArgument *arg_00;
  QMetaType QVar3;
  QDBusMenuLayoutItem *pQVar4;
  QDBusArgumentPrivate *pQVar5;
  long in_FS_OFFSET;
  QDBusArgument childArgument;
  QDBusArgument local_98;
  QMetaType local_90;
  QMetaType local_88;
  QDBusArgumentPrivate *local_80;
  QVariantMap local_78;
  QArrayDataPointer<QDBusMenuLayoutItem> QStack_70;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QDBusArgument::beginStructure();
  arg_00 = (QDBusArgument *)QDBusArgument::operator>>(arg,&item->m_id);
  operator>><QMap,_QString,_QVariant,_true>(arg_00,&item->m_properties);
  QDBusArgument::beginArray();
  cVar1 = QDBusArgument::atEnd();
  if (cVar1 == '\0') {
    do {
      local_58.shared = (PrivateShared *)0x0;
      local_58._8_8_ = 0;
      local_58._16_8_ = 0;
      local_40 = 2;
      QDBusArgument::operator>>(arg,(QDBusVariant *)&local_58);
      local_98.d = (QDBusArgumentPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      QVariant::QVariant((QVariant *)&local_80,(QVariant *)&local_58);
      local_88.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QDBusArgument>::metaType;
      local_90.d_ptr = (QMetaTypeInterface *)((ulong)QStack_70.ptr & 0xfffffffffffffffc);
      bVar2 = comparesEqual(&local_90,&local_88);
      if (bVar2) {
        if (((ulong)QStack_70.ptr & 1) == 0) {
          local_98.d = local_80;
          local_80 = (QDBusArgumentPrivate *)0x0;
        }
        else {
          pQVar5 = local_80 + *(int *)(local_80 + 4);
          if (*(int *)local_80 == 1) {
            local_98.d = *pQVar5;
            *(undefined8 *)pQVar5 = 0;
          }
          else {
            QDBusArgument::QDBusArgument(&local_98,(QDBusArgument *)pQVar5);
          }
        }
      }
      else {
        local_98.d = (QDBusArgumentPrivate *)&DAT_aaaaaaaaaaaaaaaa;
        QDBusArgument::QDBusArgument(&local_98);
        QVar3.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
        pQVar4 = (QDBusMenuLayoutItem *)&local_80;
        if (((ulong)QStack_70.ptr & 1) != 0) {
          pQVar4 = (QDBusMenuLayoutItem *)(local_80 + *(int *)(local_80 + 4));
        }
        QMetaType::convert(QVar3,pQVar4,local_88,&local_98);
      }
      QVariant::~QVariant((QVariant *)&local_80);
      local_80 = (QDBusArgumentPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      QStack_70.ptr = (QDBusMenuLayoutItem *)0x0;
      QStack_70.size = 0;
      local_78.d.d.ptr =
           (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
            )(totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
              )0x0;
      QStack_70.d = (Data *)0x0;
      operator>>(&local_98,(QDBusMenuLayoutItem *)&local_80);
      QtPrivate::QMovableArrayOps<QDBusMenuLayoutItem>::emplace<QDBusMenuLayoutItem_const&>
                ((QMovableArrayOps<QDBusMenuLayoutItem> *)&item->m_children,
                 (item->m_children).d.size,(QDBusMenuLayoutItem *)&local_80);
      QList<QDBusMenuLayoutItem>::end(&item->m_children);
      QArrayDataPointer<QDBusMenuLayoutItem>::~QArrayDataPointer(&QStack_70);
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
      ::~QExplicitlySharedDataPointerV2(&local_78.d);
      QDBusArgument::~QDBusArgument(&local_98);
      QVariant::~QVariant((QVariant *)&local_58);
      cVar1 = QDBusArgument::atEnd();
    } while (cVar1 == '\0');
  }
  QDBusArgument::endArray();
  QDBusArgument::endStructure();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return arg;
}

Assistant:

const QDBusArgument &operator>>(const QDBusArgument &arg, QDBusMenuLayoutItem &item)
{
    arg.beginStructure();
    arg >> item.m_id >> item.m_properties;
    arg.beginArray();
    while (!arg.atEnd()) {
        QDBusVariant dbusVariant;
        arg >> dbusVariant;
        QDBusArgument childArgument = qvariant_cast<QDBusArgument>(dbusVariant.variant());

        QDBusMenuLayoutItem child;
        childArgument >> child;
        item.m_children.append(child);
    }
    arg.endArray();
    arg.endStructure();
    return arg;
}